

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O3

bool __thiscall
duckdb::BinaryDeserializer::OnOptionalPropertyBegin
          (BinaryDeserializer *this,field_id_t field_id,char *s)

{
  unsigned_short value;
  unsigned_short value_1;
  field_id_t local_1c [2];
  
  if (this->has_buffered_field == true) {
    local_1c[0] = this->buffered_field;
  }
  else {
    (**this->stream->_vptr_ReadStream)(this->stream,local_1c,2);
    this->buffered_field = local_1c[0];
    this->has_buffered_field = true;
  }
  if (local_1c[0] == field_id) {
    this->has_buffered_field = false;
  }
  return local_1c[0] == field_id;
}

Assistant:

bool BinaryDeserializer::OnOptionalPropertyBegin(const field_id_t field_id, const char *s) {
	auto next_field = PeekField();
	auto present = next_field == field_id;
	if (present) {
		ConsumeField();
	}
	return present;
}